

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsXmlHelper.cpp
# Opt level: O0

VariableType KDReports::XmlHelper::stringToVariableType(QString *type)

{
  bool bVar1;
  QString *pQVar2;
  char *pcVar3;
  QByteArray local_d0;
  QMessageLogger local_b8;
  QLatin1String local_98;
  QLatin1String local_88;
  QLatin1String local_78;
  QLatin1String local_68;
  QLatin1String local_58;
  QLatin1String local_48;
  QLatin1String local_38;
  QLatin1String local_28;
  QString *local_18;
  QString *type_local;
  
  local_18 = type;
  QLatin1String::QLatin1String(&local_28,"pagenumber");
  bVar1 = ::operator==(type,local_28);
  pQVar2 = local_18;
  if (bVar1) {
    type_local._4_4_ = PageNumber;
  }
  else {
    QLatin1String::QLatin1String(&local_38,"pagecount");
    bVar1 = ::operator==(pQVar2,local_38);
    pQVar2 = local_18;
    if (bVar1) {
      type_local._4_4_ = PageCount;
    }
    else {
      QLatin1String::QLatin1String(&local_48,"textdate");
      bVar1 = ::operator==(pQVar2,local_48);
      pQVar2 = local_18;
      if (bVar1) {
        type_local._4_4_ = TextDate;
      }
      else {
        QLatin1String::QLatin1String(&local_58,"isodate");
        bVar1 = ::operator==(pQVar2,local_58);
        pQVar2 = local_18;
        if (bVar1) {
          type_local._4_4_ = ISODate;
        }
        else {
          QLatin1String::QLatin1String(&local_68,"localedate");
          bVar1 = ::operator==(pQVar2,local_68);
          pQVar2 = local_18;
          if (bVar1) {
            type_local._4_4_ = LocaleDate;
          }
          else {
            QLatin1String::QLatin1String(&local_78,"texttime");
            bVar1 = ::operator==(pQVar2,local_78);
            pQVar2 = local_18;
            if (bVar1) {
              type_local._4_4_ = TextTime;
            }
            else {
              QLatin1String::QLatin1String(&local_88,"isotime");
              bVar1 = ::operator==(pQVar2,local_88);
              pQVar2 = local_18;
              if (bVar1) {
                type_local._4_4_ = ISOTime;
              }
              else {
                QLatin1String::QLatin1String(&local_98,"localetime");
                bVar1 = ::operator==(pQVar2,local_98);
                if (bVar1) {
                  type_local._4_4_ = LocaleTime;
                }
                else {
                  QMessageLogger::QMessageLogger
                            (&local_b8,
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsXmlHelper.cpp"
                             ,0x2e,
                             "static KDReports::VariableType KDReports::XmlHelper::stringToVariableType(const QString &)"
                            );
                  pQVar2 = QtPrivate::asString(local_18);
                  QString::toLocal8Bit(&local_d0,pQVar2);
                  pcVar3 = QByteArray::constData(&local_d0);
                  QMessageLogger::warning((char *)&local_b8,"Unexpected variable type: %s",pcVar3);
                  QByteArray::~QByteArray(&local_d0);
                  type_local._4_4_ = PageNumber;
                }
              }
            }
          }
        }
      }
    }
  }
  return type_local._4_4_;
}

Assistant:

KDReports::VariableType KDReports::XmlHelper::stringToVariableType(const QString &type)
{
    if (type == QLatin1String("pagenumber"))
        return KDReports::PageNumber;
    else if (type == QLatin1String("pagecount"))
        return KDReports::PageCount;
    else if (type == QLatin1String("textdate"))
        return KDReports::TextDate;
    else if (type == QLatin1String("isodate"))
        return KDReports::ISODate;
    else if (type == QLatin1String("localedate"))
        return KDReports::LocaleDate;
    else if (type == QLatin1String("texttime"))
        return KDReports::TextTime;
    else if (type == QLatin1String("isotime"))
        return KDReports::ISOTime;
    else if (type == QLatin1String("localetime"))
        return KDReports::LocaleTime;
    qWarning("Unexpected variable type: %s", qPrintable(type));
    return KDReports::PageNumber;
}